

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::tent_dist<double>::operator()(tent_dist<double> *this,lcg64_shift *r)

{
  result_type_conflict2 rVar1;
  result_type_conflict2 in_stack_00000018;
  tent_dist<double> *in_stack_00000020;
  
  utility::uniformcc<double,trng::lcg64_shift>((lcg64_shift *)0x3498b1);
  rVar1 = icdf_(in_stack_00000020,in_stack_00000018);
  return rVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformcc<result_type>(r));
    }